

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

void Msat_SolverRemoveLearned(Msat_Solver_t *p)

{
  int iVar1;
  int iVar2;
  Msat_Clause_t **ppMVar3;
  int local_20;
  int i;
  int nLearned;
  Msat_Clause_t **pLearned;
  Msat_Solver_t *p_local;
  
  iVar1 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar3 = Msat_ClauseVecReadArray(p->vLearned);
  local_20 = 0;
  while( true ) {
    if (iVar1 <= local_20) {
      Msat_ClauseVecShrink(p->vLearned,0);
      iVar1 = Msat_ClauseVecReadSize(p->vClauses);
      p->nClauses = iVar1;
      for (local_20 = 0; local_20 < p->nVarsAlloc; local_20 = local_20 + 1) {
        p->pReasons[local_20] = (Msat_Clause_t *)0x0;
      }
      return;
    }
    iVar2 = Msat_ClauseIsLocked(p,ppMVar3[local_20]);
    if (iVar2 != 0) break;
    Msat_ClauseFree(p,ppMVar3[local_20],1);
    local_20 = local_20 + 1;
  }
  __assert_fail("!Msat_ClauseIsLocked( p, pLearned[i])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                ,0x17d,"void Msat_SolverRemoveLearned(Msat_Solver_t *)");
}

Assistant:

void Msat_SolverRemoveLearned( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned;
    int nLearned, i;

    // discard the learned clauses
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
        assert( !Msat_ClauseIsLocked( p, pLearned[i]) );
        
        Msat_ClauseFree( p, pLearned[i], 1 );
    }
    Msat_ClauseVecShrink( p->vLearned, 0 );
    p->nClauses = Msat_ClauseVecReadSize(p->vClauses);

    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pReasons[i] = NULL;
}